

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

void ZSTD_safecopy(BYTE *op,BYTE *oend_w,BYTE *ip,ptrdiff_t length,ZSTD_overlap_e ovtype)

{
  ulong uVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  BYTE *oend;
  ptrdiff_t diff;
  ptrdiff_t pStack_c8;
  ZSTD_overlap_e ovtype_local;
  ptrdiff_t length_local;
  BYTE *ip_local;
  BYTE *oend_w_local;
  BYTE *op_local;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_2;
  ptrdiff_t diff_2;
  long local_80;
  ptrdiff_t local_78;
  BYTE *local_70;
  BYTE *local_68;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_1;
  ptrdiff_t diff_1;
  long local_40;
  ptrdiff_t local_38;
  BYTE *local_30;
  int local_24;
  ulong uStack_20;
  int sub2;
  long *local_18;
  BYTE **local_10;
  
  uVar1 = (long)op - (long)ip;
  pBVar2 = op + length;
  length_local = (ptrdiff_t)ip;
  ip_local = oend_w;
  if (((ovtype != ZSTD_no_overlap) || (((-8 < (long)uVar1 && ((long)uVar1 < 8)) && (op < oend_w))))
     && ((ovtype != ZSTD_overlap_src_before_dst || ((long)uVar1 < 0)))) {
    oend_w_local = op;
    __assert_fail("(ovtype == ZSTD_no_overlap && (diff <= -8 || diff >= 8 || op >= oend_w)) || (ovtype == ZSTD_overlap_src_before_dst && diff >= 0)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x328,
                  "void ZSTD_safecopy(BYTE *, const BYTE *const, const BYTE *, ptrdiff_t, ZSTD_overlap_e)"
                 );
  }
  pBVar3 = op;
  if (length < 8) {
    while (oend_w_local = pBVar3, oend_w_local < pBVar2) {
      *oend_w_local = *(BYTE *)length_local;
      length_local = length_local + 1;
      pBVar3 = oend_w_local + 1;
    }
  }
  else {
    pStack_c8 = length;
    pBVar3 = op;
    if (ovtype == ZSTD_overlap_src_before_dst) {
      if (length < 8) {
        oend_w_local = op;
        __assert_fail("length >= 8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                      ,0x331,
                      "void ZSTD_safecopy(BYTE *, const BYTE *const, const BYTE *, ptrdiff_t, ZSTD_overlap_e)"
                     );
      }
      local_10 = &oend_w_local;
      local_18 = &length_local;
      uStack_20 = uVar1;
      if (op < ip) {
        oend_w_local = op;
        __assert_fail("*ip <= *op",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                      ,0x303,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
      }
      if (uVar1 < 8) {
        local_24 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar1 * 4);
        *op = *ip;
        op[1] = ip[1];
        op[2] = ip[2];
        op[3] = ip[3];
        length_local = (ptrdiff_t)(ip + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar1 * 4));
        pBVar3 = oend_w_local + 4;
        oend_w_local = op;
        ZSTD_copy4(pBVar3,(void *)length_local);
        *local_18 = *local_18 - (long)local_24;
      }
      else {
        oend_w_local = op;
        ZSTD_copy8(op,ip);
      }
      *local_18 = *local_18 + 8;
      *local_10 = *local_10 + 8;
      if ((long)*local_10 - *local_18 < 8) {
        __assert_fail("*op - *ip >= 8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                      ,0x315,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
      }
      pStack_c8 = length + -8;
      if ((long)oend_w_local - length_local < 8) {
        __assert_fail("op - ip >= 8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                      ,0x334,
                      "void ZSTD_safecopy(BYTE *, const BYTE *const, const BYTE *, ptrdiff_t, ZSTD_overlap_e)"
                     );
      }
      pBVar3 = oend_w_local;
      if (pBVar2 < oend_w_local) {
        __assert_fail("op <= oend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                      ,0x335,
                      "void ZSTD_safecopy(BYTE *, const BYTE *const, const BYTE *, ptrdiff_t, ZSTD_overlap_e)"
                     );
      }
    }
    oend_w_local = pBVar3;
    if (ip_local < pBVar2) {
      if (oend_w_local <= ip_local) {
        if (pBVar2 <= ip_local) {
          __assert_fail("oend > oend_w",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                        ,0x33f,
                        "void ZSTD_safecopy(BYTE *, const BYTE *const, const BYTE *, ptrdiff_t, ZSTD_overlap_e)"
                       );
        }
        local_80 = (long)ip_local - (long)oend_w_local;
        local_70 = oend_w_local;
        local_78 = length_local;
        ip_2 = oend_w_local + -length_local;
        op_2 = (BYTE *)length_local;
        oend_2 = oend_w_local;
        op_local = oend_w_local + local_80;
        if ((ovtype == ZSTD_overlap_src_before_dst) && ((long)ip_2 < 0x10)) {
          diff_2._4_4_ = 1;
          do {
            ZSTD_copy8(oend_2,op_2);
            oend_2 = oend_2 + 8;
            op_2 = op_2 + 8;
          } while (oend_2 < op_local);
        }
        else {
          diff_2._4_4_ = ovtype;
          if (((long)ip_2 < 0x10) && (-0x10 < (long)ip_2)) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/zstd_internal.h"
                          ,0xe9,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          ZSTD_copy16(oend_w_local,(void *)length_local);
          if (0x10 < local_80) {
            oend_2 = oend_2 + 0x10;
            do {
              op_2 = op_2 + 0x10;
              ZSTD_copy16(oend_2,op_2);
              oend_2 = oend_2 + 0x10;
              op_2 = op_2 + 0x10;
              ZSTD_copy16(oend_2,op_2);
              oend_2 = oend_2 + 0x10;
            } while (oend_2 < op_local);
          }
        }
        length_local = (ptrdiff_t)(ip_local + (length_local - (long)oend_w_local));
        oend_w_local = ip_local;
      }
      while (oend_w_local < pBVar2) {
        *oend_w_local = *(BYTE *)length_local;
        length_local = length_local + 1;
        oend_w_local = oend_w_local + 1;
      }
    }
    else {
      local_30 = oend_w_local;
      local_38 = length_local;
      local_40 = pStack_c8;
      ip_1 = oend_w_local + -length_local;
      op_1 = (BYTE *)length_local;
      oend_1 = oend_w_local;
      local_68 = oend_w_local + pStack_c8;
      if ((ovtype == ZSTD_overlap_src_before_dst) && ((long)ip_1 < 0x10)) {
        diff_1._4_4_ = 1;
        do {
          ZSTD_copy8(oend_1,op_1);
          oend_1 = oend_1 + 8;
          op_1 = op_1 + 8;
        } while (oend_1 < local_68);
      }
      else {
        diff_1._4_4_ = ovtype;
        if (((long)ip_1 < 0x10) && (-0x10 < (long)ip_1)) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/zstd_internal.h"
                        ,0xe9,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        ZSTD_copy16(oend_w_local,(void *)length_local);
        if (0x10 < local_40) {
          oend_1 = oend_1 + 0x10;
          do {
            op_1 = op_1 + 0x10;
            ZSTD_copy16(oend_1,op_1);
            oend_1 = oend_1 + 0x10;
            op_1 = op_1 + 0x10;
            ZSTD_copy16(oend_1,op_1);
            oend_1 = oend_1 + 0x10;
          } while (oend_1 < local_68);
        }
      }
    }
  }
  return;
}

Assistant:

static void ZSTD_safecopy(BYTE* op, const BYTE* const oend_w, BYTE const* ip, ptrdiff_t length, ZSTD_overlap_e ovtype) {
    ptrdiff_t const diff = op - ip;
    BYTE* const oend = op + length;

    assert((ovtype == ZSTD_no_overlap && (diff <= -8 || diff >= 8 || op >= oend_w)) ||
           (ovtype == ZSTD_overlap_src_before_dst && diff >= 0));

    if (length < 8) {
        /* Handle short lengths. */
        while (op < oend) *op++ = *ip++;
        return;
    }
    if (ovtype == ZSTD_overlap_src_before_dst) {
        /* Copy 8 bytes and ensure the offset >= 8 when there can be overlap. */
        assert(length >= 8);
        ZSTD_overlapCopy8(&op, &ip, diff);
        length -= 8;
        assert(op - ip >= 8);
        assert(op <= oend);
    }

    if (oend <= oend_w) {
        /* No risk of overwrite. */
        ZSTD_wildcopy(op, ip, length, ovtype);
        return;
    }
    if (op <= oend_w) {
        /* Wildcopy until we get close to the end. */
        assert(oend > oend_w);
        ZSTD_wildcopy(op, ip, oend_w - op, ovtype);
        ip += oend_w - op;
        op += oend_w - op;
    }
    /* Handle the leftovers. */
    while (op < oend) *op++ = *ip++;
}